

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

void parseHEXFile(filebuf *file)

{
  char cVar1;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  uint uVar2;
  size_type sVar3;
  _If_sv<std::basic_string_view<char>,_size_type> _Var4;
  char *pcVar5;
  reference pvVar6;
  reference this;
  reference pvVar7;
  bool bVar8;
  value_type local_5c;
  undefined1 auStack_58 [4];
  Rgba color;
  int local_48;
  undefined1 local_38 [8];
  string line;
  uint16_t maxNbColors;
  uint16_t nbColors;
  filebuf *file_local;
  
  line.field_2._14_2_ = 0;
  line.field_2._12_2_ = (ushort)options.nbColorsPerPal * (ushort)options.nbPalettes;
  do {
    std::__cxx11::string::string((string *)local_38);
    readLine(file,(string *)local_38);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
    if (sVar3 == 0) {
      local_48 = 2;
    }
    else {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      bVar8 = true;
      if (sVar3 == 6) {
        _auStack_58 = sv("0123456789ABCDEFabcdef",0x16);
        _Var4 = std::__cxx11::string::
                find_first_not_of<std::basic_string_view<char,std::char_traits<char>>>
                          ((string *)local_38,
                           (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,0);
        bVar8 = _Var4 != 0xffffffffffffffff;
      }
      if (bVar8) {
        uVar2 = (uint)(ushort)line.field_2._14_2_;
        pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
        error("Failed to parse color #%u (\"%s\"): invalid \"rrggbb\" line",(ulong)(uVar2 + 1),
              pcVar5);
        local_48 = 1;
      }
      else {
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,0);
        cVar1 = *pvVar6;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,1);
        r = toHex(cVar1,*pvVar6);
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,2);
        cVar1 = *pvVar6;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,3);
        g = toHex(cVar1,*pvVar6);
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,4);
        cVar1 = *pvVar6;
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,5);
        b = toHex(cVar1,*pvVar6);
        Rgba::Rgba(&local_5c,r,g,b,0xff);
        line.field_2._14_2_ = line.field_2._14_2_ + 1;
        if ((ushort)line.field_2._14_2_ < (ushort)line.field_2._12_2_) {
          if ((int)((ulong)(ushort)line.field_2._14_2_ %
                   (ulong)(long)(int)(uint)options.nbColorsPerPal) == 1) {
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
            emplace_back<>(&options.palSpec);
          }
          this = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::back
                           (&options.palSpec);
          pvVar7 = std::array<Rgba,_4UL>::operator[]
                             (this,(long)(int)((ulong)(ushort)line.field_2._14_2_ %
                                              (ulong)(long)(int)(uint)options.nbColorsPerPal));
          *pvVar7 = local_5c;
        }
        local_48 = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_38);
  } while (local_48 == 0);
  if ((local_48 != 1) && ((ushort)line.field_2._12_2_ < (ushort)line.field_2._14_2_)) {
    warning("HEX file contains %u colors, but there can only be %u; ignoring extra",
            (ulong)(ushort)line.field_2._14_2_,(ulong)(ushort)line.field_2._12_2_);
  }
  return;
}

Assistant:

static void parseHEXFile(std::filebuf &file) {
	// https://lospec.com/palette-list/tag/gbc

	uint16_t nbColors = 0;
	uint16_t maxNbColors = options.nbColorsPerPal * options.nbPalettes;

	for (;;) {
		std::string line;
		readLine(file, line);
		if (!line.length()) {
			break;
		}

		if (line.length() != 6
		    || line.find_first_not_of("0123456789ABCDEFabcdef"sv) != std::string::npos) {
			error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid \"rrggbb\" line",
			      nbColors + 1, line.c_str());
			return;
		}

		Rgba color =
		    Rgba(toHex(line[0], line[1]), toHex(line[2], line[3]), toHex(line[4], line[5]), 0xFF);

		++nbColors;
		if (nbColors < maxNbColors) {
			if (nbColors % options.nbColorsPerPal == 1) {
				options.palSpec.emplace_back();
			}
			options.palSpec.back()[nbColors % options.nbColorsPerPal] = color;
		}
	}

	if (nbColors > maxNbColors) {
		warning("HEX file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, maxNbColors);
	}
}